

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall md::Code::bset(Code *this,DataRegister *dx,Param *target)

{
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  uint16_t local_22;
  Param *pPStack_20;
  uint16_t opcode;
  Param *target_local;
  DataRegister *dx_local;
  Code *this_local;
  
  pPStack_20 = target;
  target_local = (Param *)dx;
  dx_local = (DataRegister *)this;
  iVar1 = (**(dx->super_Register).super_Param._vptr_Param)();
  local_22 = Param::getMXn(pPStack_20);
  local_22 = (short)(iVar1 << 9) + 0x1c0 + local_22;
  add_opcode(this,local_22);
  (*pPStack_20->_vptr_Param[2])();
  add_bytes(this,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  return this;
}

Assistant:

Code& Code::bset(const DataRegister& dx, const Param& target)
{
    uint16_t opcode = 0x01C0 + (dx.getXn() << 9) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}